

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randname.c
# Opt level: O2

size_t randname_make(randname_type name_type,size_t min,size_t max,char *word_buf,size_t buflen,
                    char ***sections)

{
  unsigned_short *puVar1;
  byte bVar2;
  undefined4 uVar3;
  char **ppcVar4;
  bool bVar5;
  randname_type rVar6;
  _Bool _Var7;
  uint32_t uVar8;
  __int32_t **pp_Var9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  char *__assertion;
  long lVar15;
  ulong uVar16;
  byte *pbVar17;
  long lVar18;
  size_t local_70;
  byte local_68;
  char *local_50;
  
  if (name_type - RANDNAME_TOLKIEN < 2) {
    if (max < buflen) {
      rVar6 = randname_make::cached_type;
      if (randname_make::cached_type != name_type) {
        ppcVar4 = sections[name_type];
        memset(randname_make::lprobs,0,0x9f78);
        for (lVar14 = 0; pbVar17 = (byte *)ppcVar4[lVar14], rVar6 = name_type,
            pbVar17 != (byte *)0x0; lVar14 = lVar14 + 1) {
          uVar11 = 0x1a;
          uVar10 = 0x1a;
          while( true ) {
            lVar18 = (long)(int)uVar11;
            bVar2 = *pbVar17;
            lVar15 = (long)(int)uVar10;
            if ((ulong)bVar2 == 0) break;
            uVar11 = uVar10 & 0xffffffff;
            pp_Var9 = __ctype_tolower_loc();
            iVar13 = (*pp_Var9)[bVar2];
            puVar1 = randname_make::lprobs[lVar18 + -1][lVar15 + 0x17] + (long)iVar13 + 0xf;
            *puVar1 = *puVar1 + 1;
            uVar10 = (long)iVar13 - 0x61;
            puVar1 = randname_make::lprobs[lVar18][lVar15] + 0x1b;
            *puVar1 = *puVar1 + 1;
            pbVar17 = pbVar17 + 1;
          }
          uVar3 = *(undefined4 *)(randname_make::lprobs[lVar18][lVar15] + 0x1a);
          *(uint *)(randname_make::lprobs[lVar18][lVar15] + 0x1a) =
               CONCAT22((short)((uint)uVar3 >> 0x10) + 1,(short)uVar3 + 1);
        }
      }
      randname_make::cached_type = rVar6;
      bVar5 = false;
      local_70 = 0;
LAB_001bdc90:
      if (bVar5) {
        return local_70;
      }
      local_70 = 0;
      iVar13 = 0;
      local_68 = 0;
      uVar11 = 0x1a;
      uVar10 = 0x1a;
      local_50 = word_buf;
LAB_001bdcc0:
      do {
        while( true ) {
          if (((9 < iVar13) || (max < local_70)) || (bVar5)) goto LAB_001bdc90;
          if (0x1a < (uint)uVar10) {
            __assertion = "c_cur >= 0 && c_cur <= S_WORD";
            uVar12 = 0x7c;
            goto LAB_001bddfe;
          }
          uVar8 = Rand_div((uint)randname_make::lprobs[uVar11][uVar10][0x1b]);
          for (uVar16 = 0; uVar12 = (uint)randname_make::lprobs[uVar11][uVar10][uVar16],
              (int)uVar12 <= (int)uVar8; uVar16 = uVar16 + 1) {
            uVar8 = uVar8 - uVar12;
          }
          if (0x1a < uVar16) {
            __assert_fail("c_next <= E_WORD",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/randname.c"
                          ,0x85,
                          "size_t randname_make(randname_type, size_t, size_t, char *, size_t, const char ***)"
                         );
          }
          if (uVar16 != 0x1a) {
            *local_50 = (char)(uVar16 + 0x61);
            _Var7 = is_a_vowel((uint)(uVar16 + 0x61) & 0xff);
            local_68 = local_68 | _Var7;
            local_50 = local_50 + 1;
            local_70 = local_70 + 1;
            uVar11 = uVar10;
            uVar10 = uVar16 & 0xffffffff;
            goto LAB_001bdcc0;
          }
          if ((min <= local_70 & local_68) != 0) break;
          iVar13 = iVar13 + 1;
        }
        *local_50 = '\0';
        bVar5 = true;
        local_68 = 1;
      } while( true );
    }
    __assertion = "buflen > max";
    uVar12 = 0x59;
  }
  else {
    __assertion = "name_type > 0 && name_type < RANDNAME_NUM_TYPES";
    uVar12 = 0x56;
  }
LAB_001bddfe:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/randname.c"
                ,uVar12,
                "size_t randname_make(randname_type, size_t, size_t, char *, size_t, const char ***)"
               );
}

Assistant:

size_t randname_make(randname_type name_type, size_t min, size_t max,
					 char *word_buf, size_t buflen, const char ***sections)
{
	size_t lnum = 0;
	bool found_word = false;

	static name_probs lprobs;
	static randname_type cached_type = RANDNAME_NUM_TYPES;

	assert(name_type > 0 && name_type < RANDNAME_NUM_TYPES);

	/* To allow for a terminating character */
	assert(buflen > max);

	/* We cache one set of probabilities, only regenerate when
	   the type changes.  It's as good a way as any for now.
	   Frankly, we could probably regenerate every time. */
	if (cached_type != name_type) {
		const char **wordlist = NULL;

		wordlist = sections[name_type];

		(void)memset(lprobs, 0, sizeof(name_probs));
		build_prob(lprobs, wordlist);

		cached_type = name_type;
	}
        
	/* Generate the actual word wanted. */
	while (!found_word) {
		char *cp = word_buf;
		int c_prev = S_WORD;
		int c_cur = S_WORD;
		int tries = 0;
		bool contains_vowel = false;
		lnum = 0;

		/* We start the word again if we run out of space or have
		   had to have 10 goes to find a word that satisfies the
		   minimal conditions. */
		while (tries < 10 && lnum <= max && !found_word) {
			/* Pick the next letter based on a simple weighting
			  of which letters can follow the previous two */
			int r;
			int c_next = 0;

			assert(c_prev >= 0 && c_prev <= S_WORD);
			assert(c_cur >= 0 && c_cur <= S_WORD);

			r = randint0(lprobs[c_prev][c_cur][TOTAL]);

			while (r >= lprobs[c_prev][c_cur][c_next]) {
				r -= lprobs[c_prev][c_cur][c_next];
				c_next++;
			}

			assert(c_next <= E_WORD);
			assert(c_next >= 0);
            
			if (c_next == E_WORD) {
				/* If we've reached the end, we check if we've
				   met the simple conditions, otherwise have
				   another go at choosing a letter for this
				   position. */
				if (lnum >= min && contains_vowel) {
					*cp = '\0';
					found_word = true;
				} else {
					tries++;
				}
			} else {
				/* Add the letter to the word and move on. */
				*cp = I2A(c_next);

				if (is_a_vowel(*cp))
					contains_vowel = true;

				cp++;
				lnum++;
				assert(c_next <= S_WORD);
				assert(c_next >= 0);
				c_prev = c_cur;
				c_cur = c_next;
			}
		}
	}

	return lnum;
}